

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atomic.h
# Opt level: O0

int init_rw_lock(fdb_rw_lock *lock)

{
  int iVar1;
  pthread_rwlock_t *in_RDI;
  int rv;
  
  iVar1 = pthread_rwlock_init(in_RDI,(pthread_rwlockattr_t *)0x0);
  return iVar1;
}

Assistant:

INLINE int init_rw_lock(fdb_rw_lock *lock) {
#if !defined(WIN32) && !defined(_WIN32)
    int rv = pthread_rwlock_init(lock, NULL);
    return rv;
#else
    InitializeSRWLock(lock);
    return 0;
#endif
}